

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  uint8_t uVar2;
  roaring_array_t *prVar3;
  byte bVar4;
  roaring_array_t *ra;
  container_t *pcVar5;
  int *c;
  int *piVar6;
  uint16_t *puVar7;
  roaring_bitmap_t *prVar8;
  uint8_t uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ushort uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_5e;
  uint8_t local_5d;
  uint8_t local_5c;
  uint8_t local_5b;
  ushort local_5a;
  ulong local_58;
  roaring_array_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_5b = '\0';
  uVar10 = (x1->high_low_container).size;
  prVar8 = x2;
  if (uVar10 != 0) {
    uVar16 = (x2->high_low_container).size;
    local_48 = (ulong)uVar16;
    prVar8 = x1;
    if (uVar16 != 0) {
      ra = &roaring_bitmap_create_with_capacity(uVar16 + uVar10)->high_low_container;
      bVar4 = 0;
      if (((x1->high_low_container).flags & 1) != 0) {
        bVar4 = (x2->high_low_container).flags & 1;
      }
      local_58 = 0;
      ra->flags = ra->flags & 0xfe | bVar4;
      uVar13 = *(x1->high_low_container).keys;
      puVar7 = (x2->high_low_container).keys;
      local_38 = (ulong)(uVar10 - 1);
      uVar15 = 0;
      local_50 = &x2->high_low_container;
      local_40 = (ulong)uVar10;
      do {
        local_5a = *puVar7;
        uVar15 = (ulong)(int)uVar15;
        while( true ) {
          prVar3 = local_50;
          uVar12 = local_58;
          iVar14 = (int)uVar15;
          if (uVar13 == local_5a) break;
          if (local_5a <= uVar13) {
            local_5e = local_50->typecodes[local_58 & 0xffff];
            pcVar5 = get_copy_of_container
                               (local_50->containers[local_58 & 0xffff],&local_5e,
                                (_Bool)(local_50->flags & 1));
            iVar14 = (int)uVar12;
            if ((prVar3->flags & 1) != 0) {
              if (((roaring_array_t *)&prVar3->size)->size <= iVar14) goto LAB_001173e0;
              prVar3->containers[iVar14] = pcVar5;
              prVar3->typecodes[iVar14] = local_5e;
            }
            local_5c = local_5e;
            extend_array(ra,1);
            iVar1 = ra->size;
            ra->keys[iVar1] = local_5a;
            ra->containers[iVar1] = pcVar5;
            ra->typecodes[iVar1] = local_5c;
            ra->size = ra->size + 1;
            uVar16 = iVar14 + 1;
            uVar10 = (uint)local_48;
            uVar12 = (ulong)uVar16;
            if (uVar16 != uVar10) goto LAB_00117351;
            uVar12 = local_48 & 0xffffffff;
            goto LAB_001173b5;
          }
          local_5d = (x1->high_low_container).typecodes[uVar15 & 0xffff];
          pcVar5 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar15 & 0xffff],&local_5d,
                              (_Bool)((x1->high_low_container).flags & 1));
          uVar9 = local_5d;
          if (((x1->high_low_container).flags & 1) != 0) {
            if ((x1->high_low_container).size <= iVar14) {
LAB_001173e0:
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            (x1->high_low_container).containers[uVar15] = pcVar5;
            (x1->high_low_container).typecodes[uVar15] = local_5d;
          }
          extend_array(ra,1);
          iVar1 = ra->size;
          ra->keys[iVar1] = uVar13;
          ra->containers[iVar1] = pcVar5;
          ra->typecodes[iVar1] = uVar9;
          ra->size = ra->size + 1;
          if ((int)local_38 == iVar14) {
            uVar10 = (uint)local_48;
            uVar12 = local_58;
            goto LAB_0011736b;
          }
          uVar15 = uVar15 + 1;
          uVar13 = (x1->high_low_container).keys[uVar15 & 0xffff];
        }
        local_5d = (x1->high_low_container).typecodes[uVar15 & 0xffff];
        local_5e = local_50->typecodes[local_58 & 0xffff];
        c = (int *)container_xor((x1->high_low_container).containers[uVar15 & 0xffff],local_5d,
                                 local_50->containers[local_58 & 0xffff],local_5e,&local_5b);
        uVar2 = local_5b;
        piVar6 = c;
        uVar9 = local_5b;
        if (local_5b == '\x04') {
          uVar9 = (uint8_t)c[2];
          if (uVar9 == '\x04') {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          piVar6 = *(int **)c;
        }
        if ((uVar9 == '\x03') || (uVar9 == '\x02')) {
          if (*piVar6 < 1) goto LAB_00117310;
LAB_00117269:
          extend_array(ra,1);
          iVar1 = ra->size;
          ra->keys[iVar1] = uVar13;
          ra->containers[iVar1] = c;
          ra->typecodes[iVar1] = uVar2;
          ra->size = ra->size + 1;
        }
        else {
          if (uVar9 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (*piVar6 != 0) {
            if (*piVar6 != -1) goto LAB_00117269;
            lVar11 = 0;
            do {
              if (*(long *)(*(long *)(piVar6 + 2) + lVar11 * 8) != 0) goto LAB_00117269;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x400);
          }
LAB_00117310:
          container_free(c,local_5b);
        }
        uVar16 = (int)local_58 + 1;
        uVar12 = (ulong)uVar16;
        uVar10 = (uint)local_48;
        if (((int)local_38 == iVar14) || (uVar16 == uVar10)) {
          uVar15 = (ulong)(iVar14 + 1);
LAB_001173b5:
          uVar16 = (uint)uVar15;
          if (uVar16 == (uint)local_40) {
LAB_0011736b:
            local_58 = uVar12;
            bVar4 = local_50->flags;
            uVar16 = (uint)local_58;
            x1 = (roaring_bitmap_t *)local_50;
          }
          else {
            if ((uint)uVar12 != uVar10) {
              return (roaring_bitmap_t *)ra;
            }
            bVar4 = (x1->high_low_container).flags;
            uVar10 = (uint)local_40;
          }
          ra_append_copy_range(ra,&x1->high_low_container,uVar16,uVar10,(_Bool)(bVar4 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar15 = uVar15 + 1;
        uVar13 = (x1->high_low_container).keys[(uint)uVar15 & 0xffff];
LAB_00117351:
        local_58 = uVar12;
        puVar7 = (uint16_t *)((ulong)((uVar16 & 0xffff) * 2) + (long)local_50->keys);
      } while( true );
    }
  }
  prVar8 = roaring_bitmap_copy(prVar8);
  return prVar8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_xor(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                &x1->high_low_container, pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}